

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

TidyMessageImpl *
prvTidytidyMessageCreateWithNode(TidyDocImpl *doc,Node *node,uint code,TidyReportLevel level,...)

{
  char in_AL;
  TidyMessageImpl *pTVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_50;
  uint local_4c;
  int col;
  int line;
  va_list args_copy;
  TidyMessageImpl *result;
  TidyReportLevel level_local;
  uint code_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (node == (Node *)0x0) {
    if (doc->lexer == (Lexer *)0x0) {
      local_110 = 0;
    }
    else {
      local_110 = doc->lexer->lines;
    }
    local_10c = local_110;
  }
  else {
    local_10c = node->line;
  }
  local_4c = local_10c;
  if (node == (Node *)0x0) {
    if (doc->lexer == (Lexer *)0x0) {
      local_118 = 0;
    }
    else {
      local_118 = doc->lexer->columns;
    }
    local_114 = local_118;
  }
  else {
    local_114 = node->column;
  }
  local_50 = local_114;
  args_copy[0].overflow_arg_area = local_108;
  args_copy[0]._0_8_ = &stack0x00000008;
  line = 0x30;
  col = 0x20;
  local_e8 = in_R8;
  local_e0 = in_R9;
  pTVar1 = tidyMessageCreateInitV(doc,node,code,local_10c,local_114,level,(__va_list_tag *)&col);
  return pTVar1;
}

Assistant:

TidyMessageImpl *TY_(tidyMessageCreateWithNode)( TidyDocImpl *doc,
                                                 Node *node,
                                                 uint code,
                                                 TidyReportLevel level,
                                                 ... )
{
    TidyMessageImpl *result;
    va_list args_copy;
    int line = ( node ? node->line :
                ( doc->lexer ? doc->lexer->lines : 0 ) );
    int col  = ( node ? node->column :
                ( doc->lexer ? doc->lexer->columns : 0 ) );
    
    va_start(args_copy, level);
    result = tidyMessageCreateInitV(doc, node, code, line, col, level, args_copy);
    va_end(args_copy);
    
    return result;
}